

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

void resolve_identity_backlink_update(lys_ident *der,lys_ident *base)

{
  ly_set *set;
  ulong uVar1;
  
  if ((der != (lys_ident *)0x0) && (base != (lys_ident *)0x0)) {
    set = base->der;
    if (set == (ly_set *)0x0) {
      set = ly_set_new();
      base->der = set;
    }
    ly_set_add(set,der,1);
    for (uVar1 = 0; uVar1 < base->base_size; uVar1 = uVar1 + 1) {
      resolve_identity_backlink_update(der,base->base[uVar1]);
    }
    return;
  }
  __assert_fail("der && base",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                ,0x15f5,
                "void resolve_identity_backlink_update(struct lys_ident *, struct lys_ident *)");
}

Assistant:

void
resolve_identity_backlink_update(struct lys_ident *der, struct lys_ident *base)
{
    int i;

    assert(der && base);

    if (!base->der) {
        /* create a set for backlinks if it does not exist */
        base->der = ly_set_new();
    }
    /* store backlink */
    ly_set_add(base->der, der, LY_SET_OPT_USEASLIST);

    /* do it recursively */
    for (i = 0; i < base->base_size; i++) {
        resolve_identity_backlink_update(der, base->base[i]);
    }
}